

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp-server.c
# Opt level: O1

int main(int argc,char **argv)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint extraout_EAX;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  FILE *__stream;
  time_t tVar11;
  int *piVar12;
  byte bVar13;
  size_t __n;
  byte *pbVar14;
  long lVar15;
  ulong uVar16;
  uint *__cp;
  long lVar17;
  char *pcVar18;
  long lVar19;
  addrinfo *paVar20;
  uint uVar21;
  void *pvVar22;
  ulong uVar23;
  bool bVar24;
  int remainingSize;
  int processedSize;
  socklen_t addr_len;
  timeval tod;
  options_occur_t opt_occurence;
  addrinfo *servinfo;
  time_t recvtime;
  server_info_t server_info_storage;
  char peer_addr [46];
  sockaddr_storage their_addr;
  int option_index;
  char s [46];
  uint local_6ac;
  int local_6a8;
  uint local_6a4;
  long local_6a0;
  ulong local_698;
  char *local_690;
  uint local_688;
  socklen_t local_684;
  char *local_680;
  char *local_678;
  timeval local_670;
  options_occur_t local_660;
  ulong local_658;
  ulong local_650;
  addrinfo *local_648;
  long local_640;
  char *local_618;
  time_t local_610;
  byte local_608;
  char local_607;
  byte local_606;
  undefined8 local_604;
  undefined8 uStack_5fc;
  char local_5f4;
  byte local_5f3;
  char local_5f2 [66];
  ulong local_5b0;
  long local_5a8;
  time_t local_5a0;
  char local_598 [48];
  addrinfo local_568 [2];
  undefined4 local_4e8;
  undefined4 local_4e4;
  uint local_4e0;
  int local_4dc;
  undefined4 uStack_4d8;
  uint local_4d4;
  ushort local_4d0 [2];
  undefined1 local_4cc [4];
  undefined8 local_4c8;
  int aiStack_4c0 [3];
  undefined8 local_4b4 [131];
  char local_98 [48];
  char local_68 [56];
  
  local_4e8 = 0;
  _opterr = 0;
  local_6a0 = CONCAT44(local_6a0._4_4_,2);
  local_698 = CONCAT44(local_698._4_4_,0xff);
  local_678 = "0.0.0.0";
  local_6a4 = 0;
  local_688 = 0;
  local_680 = (char *)0x0;
  local_650 = 0;
  local_658 = local_658 & 0xffffffff00000000;
  pcVar18 = "5351";
LAB_00101484:
  do {
    iVar5 = -0x10000;
    local_690 = pcVar18;
    do {
      while (iVar3 = getopt_long(argc,argv,"hr:v:p:",main::long_options,&local_4e8),
            pcVar18 = _optarg, 0x6f < iVar3) {
        if (iVar3 != 0x70) {
          if (iVar3 == 0x72) {
            uVar4 = atoi(_optarg);
            local_698 = CONCAT44(local_698._4_4_,uVar4);
            uVar4 = uVar4 & 0xff;
            uVar16 = (ulong)uVar4;
            pcVar18 = local_690;
            if (uVar4 == 0xff || uVar4 < 0xe) goto LAB_00101484;
            pcVar18 = 
            "Unsupported  RESULT CODE %d (acceptable values 0 <= result_code <= 13 or result_code == 255)\n"
            ;
          }
          else {
            if (iVar3 != 0x76) goto LAB_00102c0e;
            uVar4 = atoi(_optarg);
            local_6a0 = CONCAT44(local_6a0._4_4_,uVar4);
            uVar16 = (ulong)(uVar4 & 0xff);
            pcVar18 = local_690;
            if (0xfffffffd < (uVar4 & 0xff) - 3) goto LAB_00101484;
            pcVar18 = "Version %d is not supported! \n";
          }
          goto LAB_00102c69;
        }
        uVar4 = atoi(_optarg);
        if (0xffff0000 < uVar4 - 0x10000) goto LAB_00101484;
        printf("Bad value for option -p %d \n",(ulong)uVar4);
        puts("Port value can be in range 1-65535. ");
        puts("Default value will be used. ");
      }
      if (iVar3 < 0) {
        if (iVar3 != -1) goto LAB_00102c0e;
        local_606 = (byte)local_698;
        local_607 = (char)local_658;
        local_608 = (byte)local_6a0;
        local_5b0 = local_650 / 1000;
        local_5a8 = (local_650 % 1000) * 1000;
        local_5a0 = time((time_t *)0x0);
        pcVar18 = local_680;
        local_5f4 = (char)local_6a4;
        local_5f3 = (byte)local_688;
        if (local_680 == (char *)0x0) {
          local_5f2[0] = '\0';
        }
        else {
          sVar8 = strlen(local_680);
          __n = 0x40;
          if (sVar8 + 1 < 0x40) {
            __n = sVar8 + 1;
          }
          memcpy(local_5f2,pcVar18,__n);
        }
        pcVar9 = local_678;
        pcVar18 = local_690;
        printf("Server listening on %s:%s \n",local_678,local_690);
        local_660.third_party_occur = 0;
        local_660.pfailure_occur = 0;
        local_684 = 0;
        memset(&local_4e8,0,0x44c);
        bVar13 = local_607 + (local_607 == '\0');
        iVar3 = 1;
        local_598[0] = '\x01';
        local_598[1] = '\0';
        local_598[2] = '\0';
        local_598[3] = '\0';
        local_568[0].ai_addrlen = 0;
        local_568[0]._20_4_ = 0;
        local_568[0].ai_addr = (sockaddr *)0x0;
        local_568[0].ai_canonname = (char *)0x0;
        local_568[0].ai_next = (addrinfo *)0x0;
        local_568[0].ai_socktype = 2;
        local_568[0].ai_protocol = 0;
        local_568[0].ai_flags = 1;
        local_568[0].ai_family = 0;
        iVar6 = getaddrinfo(pcVar9,pcVar18,local_568,&local_648);
        if (iVar6 != 0) {
          main_cold_2();
          goto LAB_001018ec;
        }
        bVar24 = local_648 == (addrinfo *)0x0;
        if (bVar24) goto LAB_001018d5;
        paVar20 = local_648;
        goto LAB_00101866;
      }
      if (iVar3 != 0) {
        if (iVar3 != 0x3f) goto LAB_00102c0e;
        goto LAB_00102c22;
      }
      pcVar18 = main::long_options[(int)local_4e8].name;
    } while (pcVar18 == (char *)0x0);
    iVar5 = strcmp(pcVar18,"ear");
    if (iVar5 == 0) {
      iVar5 = atoi(_optarg);
      local_658 = CONCAT44(local_658._4_4_,iVar5);
    }
    iVar5 = strcmp(pcVar18,"timeout");
    if (iVar5 == 0) {
      uVar4 = atoi(_optarg);
      if ((int)uVar4 < 0) goto LAB_00102c60;
      local_650 = (ulong)uVar4;
    }
    iVar5 = strcmp(pcVar18,"app-bit");
    local_6a4 = local_6a4 & 0xff;
    if (iVar5 == 0) {
      local_6a4 = 1;
    }
    iVar5 = strcmp(pcVar18,"ret-dscp");
    if (iVar5 == 0) {
      local_688 = atoi(_optarg);
    }
    iVar5 = strcmp(pcVar18,"log-file");
    pcVar9 = _optarg;
    if (iVar5 == 0) {
      local_680 = _optarg;
    }
    iVar5 = strcmp(pcVar18,"ip");
    local_618 = pcVar9;
    if (iVar5 == 0) {
      local_678 = pcVar9;
    }
    iVar5 = strcmp(pcVar18,"ext-ip");
    if (iVar5 == 0) {
      inet_pton(10,local_618,&local_604);
    }
    iVar5 = strcmp(main::long_options[(int)local_4e8].name,"help");
    pcVar18 = local_690;
  } while (iVar5 != 0);
LAB_00102c0e:
  print_usage();
  goto LAB_00102c13;
LAB_00101866:
  do {
    iVar5 = socket(paVar20->ai_family,paVar20->ai_socktype,paVar20->ai_protocol);
    pcVar18 = "PCP server: socket";
    if (iVar5 != -1) {
      setsockopt(iVar5,1,2,local_598,4);
      iVar3 = bind(iVar5,paVar20->ai_addr,paVar20->ai_addrlen);
      if (iVar3 != -1) break;
      close(iVar5);
      pcVar18 = "PCP server: bind";
    }
    perror(pcVar18);
    paVar20 = paVar20->ai_next;
    bVar24 = paVar20 == (addrinfo *)0x0;
  } while (!bVar24);
LAB_001018d5:
  if (!bVar24) {
    freeaddrinfo(local_648);
    iVar3 = iVar5;
LAB_001018ec:
    uVar4 = (uint)bVar13;
    gettimeofday(&local_670,(__timezone_ptr_t)0x0);
    local_678 = (char *)(local_5b0 + local_670.tv_sec);
    lVar19 = local_5a8 + local_670.tv_usec;
    local_680 = (char *)CONCAT44(local_680._4_4_,iVar3);
    while( true ) {
      uVar4 = (uVar4 - 1) + (uint)(local_607 == '\0');
      local_610 = 0;
      if (local_5a8 != 0 || local_5b0 != 0) {
        gettimeofday(&local_670,(__timezone_ptr_t)0x0);
        lVar15 = lVar19 / 1000000;
        lVar17 = lVar19 % 1000000;
        lVar19 = lVar17 + 1000000;
        if (-1 < lVar17) {
          lVar19 = lVar17;
        }
        local_670.tv_sec = local_670.tv_usec / 1000000 + local_670.tv_sec;
        local_670.tv_usec = local_670.tv_usec % 1000000;
        if (local_670.tv_usec < 0) {
          local_670.tv_usec = local_670.tv_usec + 1000000;
          local_670.tv_sec = local_670.tv_sec + -1;
        }
        local_678 = local_678 + (lVar17 >> 0x3f) + lVar15;
        if (((long)local_678 < local_670.tv_sec) ||
           (lVar19 <= local_670.tv_usec && (long)local_678 <= local_670.tv_sec)) {
          local_648 = (addrinfo *)0x0;
          local_640 = 0;
          bVar24 = false;
        }
        else {
          if (local_670.tv_usec - lVar19 != 0 && lVar19 <= local_670.tv_usec) {
            auVar2 = SEXT816(local_670.tv_usec - lVar19) * SEXT816(0x431bde82d7b634db);
            iVar5 = ((int)(auVar2._8_8_ >> 0x12) - (auVar2._12_4_ >> 0x1f)) + 1;
            local_670.tv_usec = local_670.tv_usec - iVar5 * 1000000;
            local_670.tv_sec = local_670.tv_sec + iVar5;
          }
          local_648 = (addrinfo *)
                      (local_678 + ((lVar19 - local_670.tv_usec) / 1000000 - local_670.tv_sec));
          local_640 = (lVar19 - local_670.tv_usec) % 1000000;
          bVar24 = true;
          if (local_640 < 0) {
            local_640 = local_640 + 1000000;
            local_648 = (addrinfo *)((long)&local_648[-1].ai_next + 7);
          }
        }
        if (!bVar24) {
          local_648 = (addrinfo *)0x0;
          local_640 = 0;
        }
        setsockopt(iVar3,1,0x14,&local_648,0x10);
      }
      puts("###############################################");
      puts("### PCP test server: waiting to recvfrom... ###");
      puts("###############################################");
      local_684 = 0x80;
      pcVar18 = (char *)recvfrom(iVar3,&local_4e8,1099,0,(sockaddr *)local_568,&local_684);
      if ((int)pcVar18 == -1) break;
      time(&local_610);
      pcVar9 = ctime(&local_610);
      pcVar10 = inet_ntop((uint)(ushort)local_568[0].ai_flags,
                          &local_568[0].ai_family + ((ushort)local_568[0].ai_flags != 2),local_68,
                          0x2e);
      printf("PCP server: got packet at %s from %s\n",pcVar9,pcVar10);
      printf("PCP server: packet is %d bytes long\n",(ulong)pcVar18 & 0xffffffff);
      bVar13 = local_608;
      local_690 = pcVar18;
      if ((int)pcVar18 - 4U < 0x449 && ((ulong)pcVar18 & 3) == 0) {
        if (local_5f2[0] == '\0') {
          __stream = (FILE *)0x0;
        }
        else {
          umask(0);
          __stream = fopen(local_5f2,"w+");
          if (__stream == (FILE *)0x0) goto LAB_00102c27;
        }
        local_6ac = (uint)local_690;
        local_6a8 = 0;
        putchar(10);
        if (__stream == (FILE *)0x0) {
          printf("PCP version:             %i\n",(ulong)(byte)local_4e8);
        }
        else {
          fputc(10,__stream);
          printf("PCP version:             %i\n",(ulong)(byte)local_4e8);
          fprintf(__stream,"PCP version:             %i\n",(ulong)(byte)local_4e8);
        }
        printf("PCP opcode:              %i\n",(ulong)(local_4e8 >> 8 & 0x7f));
        if (__stream == (FILE *)0x0) {
          printf("PCP R bit:               %i\n",(ulong)(local_4e8._1_1_ >> 7),
                 (ulong)(local_4e8._1_1_ >> 7));
        }
        else {
          fprintf(__stream,"PCP opcode:              %i\n",(ulong)(local_4e8._1_1_ & 0x7f));
          printf("PCP R bit:               %i\n",(ulong)(local_4e8._1_1_ >> 7));
          fprintf(__stream,"PCP R bit:               %i\n",(ulong)(local_4e8._1_1_ >> 7));
        }
        printf("PCP requested lifetime:  %lu\n",
               (ulong)(local_4e4 >> 0x18 | (local_4e4 & 0xff0000) >> 8 | (local_4e4 & 0xff00) << 8 |
                      local_4e4 << 0x18));
        if (__stream != (FILE *)0x0) {
          fprintf(__stream,"PCP requested lifetime:  %lu\n",
                  (ulong)(local_4e4 >> 0x18 | (local_4e4 & 0xff0000) >> 8 |
                          (local_4e4 & 0xff00) << 8 | local_4e4 << 0x18));
        }
        if (((local_4e0 == 0) && (local_4dc == 0)) && (uStack_4d8 == -0x10000)) {
          pcVar18 = inet_ntop(2,&local_4d4,local_98,0x2e);
          printf("PEER IP: \t\t %s\n",pcVar18);
          if (__stream == (FILE *)0x0) goto LAB_00101e56;
          iVar5 = 2;
          __cp = &local_4d4;
LAB_00101e03:
          pcVar18 = inet_ntop(iVar5,__cp,local_98,0x2e);
          fprintf(__stream,"PEER IP: \t\t %s\n",pcVar18);
          local_6ac = (int)local_690 - 0x18;
          local_6a8 = 0x18;
          putchar(10);
          if (__stream != (FILE *)0x0) {
            fputc(10,__stream);
          }
        }
        else {
          pcVar18 = inet_ntop(10,&local_4e0,local_98,0x2e);
          printf("PEER IP: \t\t %s\n",pcVar18);
          if (__stream != (FILE *)0x0) {
            iVar5 = 10;
            __cp = &local_4e0;
            goto LAB_00101e03;
          }
LAB_00101e56:
          local_6ac = (int)local_690 - 0x18;
          local_6a8 = 0x18;
          putchar(10);
        }
        uVar21 = 1;
        if ((byte)local_4e8 <= bVar13) {
          if ((local_4e8 & 0xff) == 2) {
            uVar7 = 0;
            if ((local_4e8._1_1_ & 0x7f) == 1) {
              uVar21 = local_6ac - 0x24;
              local_6ac = uVar21;
              if (-1 < (int)uVar21) {
                lVar15 = (long)local_6a8;
                puts("PCP protocol VERSION 2. ");
                if (__stream != (FILE *)0x0) {
                  fwrite("PCP protocol VERSION 2. \n",0x19,1,__stream);
                }
                local_6a0 = lVar15;
                printf("MAP protocol: \t\t %d\n",(ulong)*(byte *)((long)&local_4dc + lVar15));
                if (__stream != (FILE *)0x0) {
                  fprintf(__stream,"MAP protocol: \t\t %d\n",
                          (ulong)*(byte *)((long)&local_4dc + lVar15));
                }
                printf("MAP int port: \t\t %d\n",
                       (ulong)(ushort)(*(ushort *)((long)&uStack_4d8 + lVar15) << 8 |
                                      *(ushort *)((long)&uStack_4d8 + lVar15) >> 8));
                if (__stream != (FILE *)0x0) {
                  fprintf(__stream,"MAP int port: \t\t %d\n",
                          (ulong)(ushort)(*(ushort *)((long)&uStack_4d8 + lVar15) << 8 |
                                         *(ushort *)((long)&uStack_4d8 + lVar15) >> 8));
                }
                uVar1 = *(ushort *)((long)&uStack_4d8 + lVar15 + 2);
                printf("MAP ext port: \t\t %d\n",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
                if (__stream != (FILE *)0x0) {
                  uVar1 = *(ushort *)((long)&uStack_4d8 + lVar15 + 2);
                  fprintf(__stream,"MAP ext port: \t\t %d\n",
                          (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
                }
                pvVar22 = (void *)((long)local_4d0 + lVar15 + -4);
                pcVar18 = inet_ntop(10,pvVar22,(char *)&local_648,0x2e);
                printf("MAP Ext IP: \t\t %s\n",pcVar18);
                if (__stream != (FILE *)0x0) {
                  pcVar18 = inet_ntop(10,pvVar22,(char *)&local_648,0x2e);
                  fprintf(__stream,"MAP Ext IP: \t\t %s\n",pcVar18);
                }
                local_6a8 = (int)local_6a0 + 0x24;
                uVar7 = 0;
                printf("Remaining size is %d \n",(ulong)uVar21);
                if (uVar21 != 0) {
                  local_6a4 = uVar4;
                  local_6a0 = lVar19;
                  do {
                    uVar7 = print_PCP_options(&local_4e8,(int *)&local_6ac,&local_6a8,&local_660,
                                              (FILE *)__stream);
                    lVar19 = local_6a0;
                    uVar4 = local_6a4;
                  } while (0 < (int)local_6ac);
                }
                goto LAB_001020fa;
              }
              bVar24 = false;
              uVar21 = 6;
              uVar7 = 0;
            }
            else {
LAB_001020fa:
              uVar21 = local_6ac;
              if ((local_4e8._1_1_ & 0x7f) == 2) {
                local_6ac = local_6ac - 0x38;
                printf("Remaining size is %d \n");
                local_698 = (ulong)(uVar21 - 0x38);
                local_6a4 = uVar4;
                if (-1 < (int)(uVar21 - 0x38)) {
                  lVar15 = (long)local_6a8;
                  puts("PCP protocol VERSION 2. ");
                  if (__stream == (FILE *)0x0) {
                    puts("PEER Opcode specific information. ");
                  }
                  else {
                    fwrite("PCP protocol VERSION 2. \n",0x19,1,__stream);
                    puts("PEER Opcode specific information. ");
                    fwrite("PEER Opcode specific information. \n",0x23,1,__stream);
                  }
                  local_6a0 = lVar15;
                  printf("Protocol: \t\t %d\n",(ulong)*(byte *)((long)&local_4dc + lVar15));
                  if (__stream != (FILE *)0x0) {
                    fprintf(__stream,"Protocol: \t\t %d\n",
                            (ulong)*(byte *)((long)&local_4dc + lVar15));
                  }
                  printf("Internal port: \t\t %d\n",
                         (ulong)(ushort)(*(ushort *)((long)&uStack_4d8 + lVar15) << 8 |
                                        *(ushort *)((long)&uStack_4d8 + lVar15) >> 8));
                  if (__stream != (FILE *)0x0) {
                    fprintf(__stream,"Internal port: \t\t %d\n",
                            (ulong)(ushort)(*(ushort *)((long)&uStack_4d8 + lVar15) << 8 |
                                           *(ushort *)((long)&uStack_4d8 + lVar15) >> 8));
                  }
                  pvVar22 = (void *)((long)local_4d0 + lVar15 + -4);
                  pcVar18 = inet_ntop(10,pvVar22,(char *)&local_648,0x2e);
                  printf("External IP: \t\t %s\n",pcVar18);
                  if (__stream != (FILE *)0x0) {
                    pcVar18 = inet_ntop(10,pvVar22,(char *)&local_648,0x2e);
                    fprintf(__stream,"External IP: \t\t %s\n",pcVar18);
                  }
                  uVar1 = *(ushort *)((long)&uStack_4d8 + lVar15 + 2);
                  printf("External port: \t\t %d\n",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
                  if (__stream != (FILE *)0x0) {
                    uVar1 = *(ushort *)((long)&uStack_4d8 + lVar15 + 2);
                    fprintf(__stream,"External port: \t\t %d\n",
                            (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
                  }
                  if (((*(int *)((long)aiStack_4c0 + lVar15) == 0) &&
                      (*(int *)((long)aiStack_4c0 + lVar15 + 4) == 0)) &&
                     (*(int *)((long)local_4b4 + lVar15 + -4) == -0x10000)) {
                    pvVar22 = (void *)((long)local_4b4 + lVar15);
                    pcVar18 = inet_ntop(2,pvVar22,local_598,0x2e);
                    printf("PEER IP: \t\t %s\n",pcVar18);
                    if (__stream != (FILE *)0x0) {
                      iVar5 = 2;
LAB_00102762:
                      pcVar18 = inet_ntop(iVar5,pvVar22,local_598,0x2e);
                      fprintf(__stream,"PEER IP: \t\t %s\n",pcVar18);
                    }
                  }
                  else {
                    pvVar22 = (void *)((long)aiStack_4c0 + lVar15);
                    pcVar18 = inet_ntop(10,pvVar22,local_598,0x2e);
                    printf("PEER IP: \t\t %s\n",pcVar18);
                    if (__stream != (FILE *)0x0) {
                      iVar5 = 10;
                      goto LAB_00102762;
                    }
                  }
                  uVar1 = *(ushort *)((long)&local_4c8 + lVar15 + 4);
                  printf("PEER port: \t\t %d\n",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
                  if (__stream != (FILE *)0x0) {
                    uVar1 = *(ushort *)((long)&local_4c8 + lVar15 + 4);
                    fprintf(__stream,"PEER port: \t\t %d\n",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8)
                           );
                  }
                  local_6a8 = (int)local_6a0 + 0x38;
                  if ((uint)local_698 != 0) {
                    local_6a0 = lVar19;
                    do {
                      uVar7 = print_PCP_options(&local_4e8,(int *)&local_6ac,&local_6a8,&local_660,
                                                (FILE *)__stream);
                      lVar19 = local_6a0;
                    } while (0 < (int)local_6ac);
                  }
                }
                uVar4 = local_6a4;
                if ((int)(uint)local_698 < 0) {
                  uVar21 = 6;
                  bVar24 = false;
                  goto LAB_00102a8b;
                }
              }
              uVar21 = 6;
              bVar24 = true;
              if ((local_4e8._1_1_ & 0x7f) == 3) {
                bVar24 = 0xd < (int)local_6ac;
                if ((int)local_6ac < 0xe) {
                  uVar21 = 3;
                }
                else {
                  local_688 = local_6ac;
                  local_658 = (ulong)local_6a8;
                  puts("PCP protocol VERSION 2. ");
                  if (__stream == (FILE *)0x0) {
                    puts("SADSCP Opcode specific information. ");
                  }
                  else {
                    fwrite("PCP protocol VERSION 2. \n",0x19,1,__stream);
                    puts("SADSCP Opcode specific information. ");
                    fwrite("SADSCP Opcode specific information. \n",0x25,1,__stream);
                  }
                  uVar16 = local_658;
                  uVar23 = (long)&local_4e8 + local_658;
                  printf("Jitter tolerance:\t %d\n",
                         (ulong)(*(byte *)((long)&local_4dc + local_658) >> 2 & 3));
                  local_698 = uVar23;
                  if (__stream == (FILE *)0x0) {
                    bVar13 = *(byte *)((long)&local_4dc + uVar16) >> 4 & 3;
                    printf("Loss tolerance: \t %d\n",(ulong)bVar13,(ulong)bVar13);
                  }
                  else {
                    fprintf(__stream,"Jitter tolerance:\t %d\n",
                            (ulong)(*(byte *)((long)&local_4dc + uVar16) >> 2 & 3));
                    printf("Loss tolerance: \t %d\n",(ulong)(*(byte *)(local_698 + 0xc) >> 4 & 3));
                    fprintf(__stream,"Loss tolerance: \t %d\n",
                            (ulong)(*(byte *)(local_698 + 0xc) >> 4 & 3));
                  }
                  printf("Delay tolerance:  \t %d\n",(ulong)(*(byte *)(local_698 + 0xc) >> 6));
                  if (__stream != (FILE *)0x0) {
                    fprintf(__stream,"Delay tolerance:  \t %d\n",
                            (ulong)(*(byte *)(local_698 + 0xc) >> 6));
                  }
                  printf("App name length: \t %d\n",(ulong)*(byte *)(local_698 + 0xd));
                  if (__stream != (FILE *)0x0) {
                    fprintf(__stream,"App name length: \t %d\n",(ulong)*(byte *)(local_698 + 0xd));
                  }
                  uVar16 = local_698;
                  lVar15 = local_698 + 0xe;
                  local_6a4 = uVar4;
                  local_6a0 = lVar19;
                  printf("App name:        \t %.*s\n",(ulong)*(byte *)(local_698 + 0xd),lVar15);
                  if (__stream != (FILE *)0x0) {
                    fprintf(__stream,"App name:        \t %.*s\n",(ulong)*(byte *)(uVar16 + 0xd),
                            lVar15);
                  }
                  uVar4 = (uint)*(byte *)(uVar16 + 0xd);
                  local_6a8 = (int)local_658 + uVar4 + 0xe;
                  iVar5 = uVar4 + 0xe;
                  local_6ac = local_688 - iVar5;
                  if (local_6ac != 0 && iVar5 <= (int)local_688) {
                    do {
                      uVar7 = print_PCP_options(&local_4e8,(int *)&local_6ac,&local_6a8,&local_660,
                                                (FILE *)__stream);
                    } while (0 < (int)local_6ac);
                  }
                  bVar24 = true;
                  lVar19 = local_6a0;
                  uVar4 = local_6a4;
                }
              }
            }
LAB_00102a8b:
            if (!bVar24) goto LAB_00102a99;
          }
          else {
            if ((local_4e8 & 0xff) != 1) goto LAB_00102a99;
            uVar7 = 0;
            if ((local_4e8._1_1_ & 0x7f) == 1) {
              uVar21 = local_6ac - 0x18;
              local_6ac = uVar21;
              if ((int)uVar21 < 0) {
                uVar7 = 0;
              }
              else {
                lVar15 = (long)local_6a8;
                puts("PCP protocol VERSION 1. ");
                pbVar14 = (byte *)((long)&local_4e8 + lVar15);
                local_6a0 = lVar15;
                if (__stream == (FILE *)0x0) {
                  printf("MAP protocol: \t\t %d\n",(ulong)*pbVar14);
                }
                else {
                  fwrite("PCP protocol VERSION 1. \n",0x19,1,__stream);
                  printf("MAP protocol: \t\t %d\n",(ulong)*pbVar14);
                  fprintf(__stream,"MAP protocol: \t\t %d\n",(ulong)*pbVar14);
                }
                printf("MAP int port: \t\t %d\n",
                       (ulong)(ushort)(*(ushort *)((long)&local_4e4 + lVar15) << 8 |
                                      *(ushort *)((long)&local_4e4 + lVar15) >> 8));
                if (__stream != (FILE *)0x0) {
                  fprintf(__stream,"MAP int port: \t\t %d\n",
                          (ulong)(ushort)(*(ushort *)((long)&local_4e4 + lVar15) << 8 |
                                         *(ushort *)((long)&local_4e4 + lVar15) >> 8));
                }
                uVar1 = *(ushort *)((long)&local_4e4 + lVar15 + 2);
                printf("MAP ext port: \t\t %d\n",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
                if (__stream != (FILE *)0x0) {
                  uVar1 = *(ushort *)((long)&local_4e4 + lVar15 + 2);
                  fprintf(__stream,"MAP ext port: \t\t %d\n",
                          (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
                }
                pcVar18 = inet_ntop(10,(void *)((long)&local_4e0 + lVar15),(char *)&local_648,0x2e);
                printf("MAP Ext IP: \t\t %s\n",pcVar18);
                if (__stream != (FILE *)0x0) {
                  pcVar18 = inet_ntop(10,(void *)((long)&local_4e0 + lVar15),(char *)&local_648,0x2e
                                     );
                  fprintf(__stream,"MAP Ext IP: \t\t %s\n",pcVar18);
                }
                local_6a8 = (int)local_6a0 + 0x18;
                uVar7 = 0;
                printf("Remaining size is %d \n",(ulong)uVar21);
                if (uVar21 != 0) {
                  local_698 = CONCAT44(local_698._4_4_,uVar21);
                  local_6a4 = uVar4;
                  local_6a0 = lVar19;
                  do {
                    uVar7 = print_PCP_options(&local_4e8,(int *)&local_6ac,&local_6a8,&local_660,
                                              (FILE *)__stream);
                  } while (0 < (int)local_6ac);
                  lVar19 = local_6a0;
                  uVar4 = local_6a4;
                  uVar21 = (uint)local_698;
                }
              }
              if (-1 < (int)uVar21) goto LAB_00102308;
LAB_001025b6:
              uVar21 = 6;
              goto LAB_00102a99;
            }
LAB_00102308:
            uVar21 = local_6ac;
            if ((local_4e8._1_1_ & 0x7f) == 2) {
              local_6ac = local_6ac - 0x18;
              printf("Remaining size is %d \n");
              uVar21 = uVar21 - 0x18;
              if (-1 < (int)uVar21) {
                lVar15 = (long)local_6a8;
                puts("PCP protocol VERSION 1. ");
                local_698 = (ulong)uVar21;
                if (__stream == (FILE *)0x0) {
                  puts("PEER Opcode specific information. ");
                }
                else {
                  fwrite("PCP protocol VERSION 1. \n",0x19,1,__stream);
                  puts("PEER Opcode specific information. ");
                  fwrite("PEER Opcode specific information. \n",0x23,1,__stream);
                }
                local_6a4 = uVar4;
                local_6a0 = lVar15;
                printf("Protocol: \t\t %d\n",(ulong)*(byte *)((long)&local_4e8 + lVar15));
                if (__stream != (FILE *)0x0) {
                  fprintf(__stream,"Protocol: \t\t %d\n",(ulong)*(byte *)((long)&local_4e8 + lVar15)
                         );
                }
                printf("Internal port: \t\t %d\n",
                       (ulong)(ushort)(*(ushort *)((long)&local_4e4 + lVar15) << 8 |
                                      *(ushort *)((long)&local_4e4 + lVar15) >> 8));
                if (__stream != (FILE *)0x0) {
                  fprintf(__stream,"Internal port: \t\t %d\n",
                          (ulong)(ushort)(*(ushort *)((long)&local_4e4 + lVar15) << 8 |
                                         *(ushort *)((long)&local_4e4 + lVar15) >> 8));
                }
                pcVar18 = inet_ntop(10,(void *)((long)&local_4e0 + lVar15),(char *)&local_648,0x2e);
                printf("External IP: \t\t %s\n",pcVar18);
                if (__stream != (FILE *)0x0) {
                  pcVar18 = inet_ntop(10,(void *)((long)&local_4e0 + lVar15),(char *)&local_648,0x2e
                                     );
                  fprintf(__stream,"External IP: \t\t %s\n",pcVar18);
                }
                uVar1 = *(ushort *)((long)&local_4e4 + lVar15 + 2);
                printf("External port port: \t\t %d\n",(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
                if (__stream != (FILE *)0x0) {
                  uVar1 = *(ushort *)((long)&local_4e4 + lVar15 + 2);
                  fprintf(__stream,"External port port: \t\t %d\n",
                          (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
                }
                pcVar18 = inet_ntop(10,local_4cc + lVar15,local_598,0x2e);
                printf("PEER IP: \t\t %s\n",pcVar18);
                if (__stream != (FILE *)0x0) {
                  pcVar18 = inet_ntop(10,local_4cc + lVar15,local_598,0x2e);
                  fprintf(__stream,"PEER IP: \t\t %s\n",pcVar18);
                }
                printf("PEER port port: \t\t %d\n",
                       (ulong)(ushort)(*(ushort *)((long)local_4d0 + lVar15) << 8 |
                                      *(ushort *)((long)local_4d0 + lVar15) >> 8));
                if (__stream != (FILE *)0x0) {
                  fprintf(__stream,"PEER port port: \t\t %d\n",
                          (ulong)(ushort)(*(ushort *)((long)local_4d0 + lVar15) << 8 |
                                         *(ushort *)((long)local_4d0 + lVar15) >> 8));
                }
                local_6a8 = (int)local_6a0 + 0x2c;
                uVar21 = (uint)local_698;
                uVar4 = local_6a4;
                if (uVar21 != 0) {
                  local_6a0 = lVar19;
                  do {
                    uVar7 = print_PCP_options(&local_4e8,(int *)&local_6ac,&local_6a8,&local_660,
                                              (FILE *)__stream);
                  } while (0 < (int)local_6ac);
                  uVar21 = (uint)local_698;
                  lVar19 = local_6a0;
                  uVar4 = local_6a4;
                }
              }
              if ((int)uVar21 < 0) goto LAB_001025b6;
            }
          }
          fflush(__stream);
          uVar21 = uVar7;
        }
      }
      else {
        puts(
            "Size of PCP packet is either smaller than 4 octets or larger than 1100 bytes or the size is not multiple of 4."
            );
        printf("The size was: %d \n",(ulong)pcVar18 & 0xffffffff);
        uVar21 = 3;
      }
LAB_00102a99:
      if (local_606 != 0xff) {
        uVar21 = (uint)local_606;
      }
      _local_4dc = 0;
      local_4d4 = 0;
      uVar1 = (ushort)local_4e8;
      local_4e8._0_3_ = (uint3)(uVar1 | 0x8000);
      local_4e8 = CONCAT13((char)uVar21,(uint3)local_4e8);
      tVar11 = time((time_t *)0x0);
      uVar7 = (int)tVar11 - (int)local_5a0;
      local_4e0 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                  uVar7 * 0x1000000;
      iVar3 = (int)local_680;
      if (uVar21 == 1) {
        local_4e8 = CONCAT31(local_4e8._1_3_,local_608);
      }
      else if ((local_4e8._1_1_ & 0x7f) == 3) {
        local_4c8._0_5_ = CONCAT14(local_5f4 << 7 | local_5f3,(undefined4)local_4c8);
      }
      else if ((local_4e8._1_1_ & 0x7f) == 1) {
        if ((local_4e8 & 0xff) == 2) {
          aiStack_4c0[1] = (int)local_604;
          aiStack_4c0[2] = (int)((ulong)local_604 >> 0x20);
          local_4b4[0] = uStack_5fc;
        }
        else if ((local_4e8 & 0xff) == 1) {
          local_4c8 = local_604;
          aiStack_4c0[0] = (int)uStack_5fc;
          aiStack_4c0[1] = (int)((ulong)uStack_5fc >> 0x20);
        }
      }
      sendto((int)local_680,&local_4e8,(long)(int)local_690,0,(sockaddr *)local_568,local_684);
      local_660.third_party_occur = 0;
      local_660.pfailure_occur = 0;
      putchar(10);
      if (uVar4 == 0) {
        puts("Closing sockfd ");
        close(iVar3);
        return 0;
      }
    }
    main_cold_3();
LAB_00102c22:
    main_cold_1();
LAB_00102c27:
    piVar12 = __errno_location();
    pcVar18 = strerror(*piVar12);
    printf("%s:%d \"\": %s \n","printPCPreq",0x1b5,pcVar18);
    goto LAB_00102c13;
  }
  main_cold_4();
  uVar4 = extraout_EAX;
LAB_00102c60:
  pcVar18 = "Value provided for timeout was negative %d. Please provide correct value.\n";
  uVar16 = (ulong)uVar4;
LAB_00102c69:
  printf(pcVar18,uVar16);
LAB_00102c13:
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {

    const char *port = PCP_PORT;
    int test_port;
    uint8_t pcp_version = PCP_TEST_MAX_VERSION;
    uint8_t end_after_recv = 0;
    uint8_t default_result_code = 255;
#ifdef WIN32
    long timeout_us = 0;
#else
    suseconds_t timeout_us = 0;
#endif
    server_info_t server_info_storage;
    const char *server_ip = "0.0.0.0";
    uint8_t app_bit = 0;
    uint8_t ret_dscp = 0;
    char *log_file = NULL;

    {
        int c;
        int option_index = 0;

        static struct option long_options[] = {
            {"ear", required_argument, 0, 0},
            {"help", no_argument, 0, 0},
            {"ip", required_argument, 0, 0},
            {"ext-ip", required_argument, 0, 0},
            {"timeout", required_argument, 0, 0},
            {"app-bit", no_argument, 0, 0},
            {"ret-dscp", required_argument, 0, 0},
            {"log-file", required_argument, 0, 0},
            {0, 0, 0, 0}};

        opterr = 0;
        while ((c = getopt_long(argc, argv, "hr:v:p:", long_options,
                                &option_index)) != -1) {
            switch (c) {
            // assign values for long options
            case 0:
                if (!long_options[option_index].name) {
                    break;
                }

                if (!strcmp(long_options[option_index].name, "ear"))
                    end_after_recv = (uint8_t)atoi(optarg);

                if (!strcmp(long_options[option_index].name, "timeout")) {
                    int temp_timeout = atoi(optarg);
                    if (temp_timeout < 0) {
                        printf("Value provided for timeout was negative %d. "
                               "Please provide correct value.\n",
                               temp_timeout);
                        exit(1);
                    } else {
#ifdef WIN32
                        timeout_us = (long)atoi(optarg);
#else
                        timeout_us = (suseconds_t)atoi(optarg);
#endif
                    }
                }

                if (!strcmp(long_options[option_index].name, "app-bit")) {
                    app_bit = 1;
                }

                if (!strcmp(long_options[option_index].name, "ret-dscp")) {
                    ret_dscp = (uint8_t)atoi(optarg);
                }

                if (!strcmp(long_options[option_index].name, "log-file")) {
                    log_file = optarg;
                }

                if (!strcmp(long_options[option_index].name, "ip"))
                    server_ip = optarg;

                if (!strcmp(long_options[option_index].name, "ext-ip")) {
                    inet_pton(AF_INET6, optarg, &server_info_storage.ext_ip);
                }

                if (!strcmp(long_options[option_index].name, "help")) {
                    print_usage();
                    exit(1);
                }

                break;
            case 'h':
                print_usage();
                exit(1);
                break;
            case 'p':
                test_port = atoi(optarg);
                if ((test_port < 1) || (test_port > 65535)) {
                    printf("Bad value for option -p %d \n", test_port);
                    printf("Port value can be in range 1-65535. \n");
                    printf("Default value will be used. \n");
                } else {
                    port = optarg;
                }
                break;
            case 'r':
                default_result_code = (uint8_t)atoi(optarg);
                if (default_result_code > 13 && default_result_code != 255) {
                    printf("Unsupported  RESULT CODE %d (acceptable values "
                           "0 <= result_code <= 13 or result_code == 255)\n",
                           default_result_code);
                    exit(1);
                }
                break;
            case 'v':
                pcp_version = (uint8_t)atoi(optarg);
                if (pcp_version < 1 || pcp_version > 2) {
                    printf("Version %d is not supported! \n", pcp_version);
                    exit(1);
                }
                break;
            case '?':
                if (isprint(optopt))
                    fprintf(stderr, "Unknown option `-%c'.\n", optopt);
                else
                    fprintf(stderr, "Unknown option character `\\x%x'.\n",
                            optopt);
                print_usage();
                exit(1);
            default: // LCOV_EXCL_START
                print_usage();
                exit(1);
                break; // LCOV_EXCL_STOP
            }
        }
    }

    server_info_storage.default_result_code = default_result_code;
    server_info_storage.end_after_recv = end_after_recv;
    server_info_storage.server_version = pcp_version;
    server_info_storage.tv.tv_sec = timeout_us / 1000;
    server_info_storage.tv.tv_usec = (timeout_us % 1000) * 1000;
    server_info_storage.epoch_time_start = time(NULL);
    server_info_storage.app_bit = app_bit;
    server_info_storage.ret_dscp = ret_dscp;
    if (log_file != NULL) {
        memcpy(&(server_info_storage.log_file[0]), log_file,
               min(strlen(log_file) + 1, MAX_LOG_FILE));
    } else {
        server_info_storage.log_file[0] = 0;
    }

    printf("Server listening on %s:%s \n", server_ip, port);
    return execPCPServer(port, server_ip, &server_info_storage);
}